

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flowtest.cc
# Opt level: O1

Token __thiscall flowtest::Lexer::parseNumber(Lexer *this)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  bool bVar4;
  
  this->numberValue_ = 0;
  uVar2 = (ulong)(this->currentPos_).offset;
  bVar4 = (this->source_)._M_string_length == uVar2;
  while ((!bVar4 && ((int)(this->source_)._M_dataplus._M_p[uVar2] - 0x30U < 10))) {
    uVar1 = this->numberValue_ * 10;
    this->numberValue_ = uVar1;
    iVar3 = -0x31;
    if (!bVar4) {
      iVar3 = (this->source_)._M_dataplus._M_p[uVar2] + -0x30;
    }
    this->numberValue_ = iVar3 + uVar1;
    nextChar(this,1);
    uVar2 = (ulong)(this->currentPos_).offset;
    bVar4 = (this->source_)._M_string_length == uVar2;
  }
  return Number;
}

Assistant:

Token Lexer::parseNumber() {
  numberValue_ = 0;

  while (std::isdigit(currentChar())) {
    numberValue_ *= 10;
    numberValue_ += currentChar() - '0';
    nextChar();
  }
  return Token::Number;
}